

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcTrimmedCurve::~IfcTrimmedCurve(IfcTrimmedCurve *this)

{
  pointer *ppsVar1;
  pointer psVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)((long)&this[-1].SenseAgreement.field_2 + 8) = 0x8381a8;
  (this->SenseAgreement)._M_dataplus._M_p = (pointer)0x838270;
  this[-1].MasterRepresentation._M_string_length = 0x8381d0;
  *(undefined8 *)((long)&this[-1].MasterRepresentation.field_2 + 8) = 0x8381f8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x838220;
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x838248;
  psVar2 = (this->Trim1).
           super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           .
           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppsVar1 = &(this->Trim2).
             super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             .
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != (pointer)ppsVar1) {
    operator_delete(psVar2,(ulong)((long)&((*ppsVar1)->
                                          super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + 1));
  }
  puVar3 = *(undefined1 **)&(this->super_IfcBoundedCurve).field_0x48;
  if ((Out *)puVar3 != &this->Trim1) {
    operator_delete(puVar3,(ulong)((long)&(((this->Trim1).
                                            super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                                            .
                                            super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + 1));
  }
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
                field_0x30);
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
                super_IfcRepresentationItem.
                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18);
  operator_delete((void *)((long)&this[-1].SenseAgreement.field_2 + 8),0xe0);
  return;
}

Assistant:

IfcTrimmedCurve() : Object("IfcTrimmedCurve") {}